

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O2

LY_ERR ly_pattern_code_match(pcre2_code_8 *pcode,char *str,size_t str_len,ly_err_item **err)

{
  int iVar1;
  LY_ERR LVar2;
  long lVar3;
  PCRE2_UCHAR8 pcre2_errmsg [256];
  
  lVar3 = pcre2_match_data_create_from_pattern_8(pcode,0);
  if (lVar3 != 0) {
    iVar1 = pcre2_match_8(pcode,str,str_len,0,0xa0000000,lVar3,0);
    pcre2_match_data_free_8(lVar3);
    if (iVar1 < -1) {
      memset(pcre2_errmsg,0,0x100);
      pcre2_get_error_message_8(iVar1,pcre2_errmsg,0x100);
      LVar2 = ly_err_new(err,LY_ESYS,LYVE_SUCCESS,(char *)0x0,(char *)0x0,"%s",pcre2_errmsg);
    }
    else {
      LVar2 = LY_SUCCESS;
      if (iVar1 == -1) {
        LVar2 = LY_ENOT;
      }
    }
    return LVar2;
  }
  LVar2 = ly_err_new(err,LY_EMEM,LYVE_SUCCESS,(char *)0x0,(char *)0x0,"Memory allocation failed.");
  return LVar2;
}

Assistant:

LY_ERR
ly_pattern_code_match(pcre2_code *pcode, const char *str, size_t str_len, struct ly_err_item **err)
{
    int r, match_opts;
    pcre2_match_data *match_data = NULL;

    /* match_data needs to be allocated each time because of possible multi-threaded evaluation */
    match_data = pcre2_match_data_create_from_pattern(pcode, NULL);
    if (!match_data) {
        return ly_err_new(err, LY_EMEM, 0, NULL, NULL, LY_EMEM_MSG);
    }

    match_opts = PCRE2_ANCHORED;
#ifdef PCRE2_ENDANCHORED
    /* PCRE2_ENDANCHORED was added in PCRE2 version 10.30 */
    match_opts |= PCRE2_ENDANCHORED;
#endif
    r = pcre2_match(pcode, (PCRE2_SPTR)str, str_len, 0, match_opts, match_data, NULL);
    pcre2_match_data_free(match_data);

    if ((r != PCRE2_ERROR_NOMATCH) && (r < 0)) {
        PCRE2_UCHAR pcre2_errmsg[LY_PCRE2_MSG_LIMIT] = {0};

        pcre2_get_error_message(r, pcre2_errmsg, LY_PCRE2_MSG_LIMIT);
        return ly_err_new(err, LY_ESYS, 0, NULL, NULL, "%s", (const char *)pcre2_errmsg);
    }

    return (r == PCRE2_ERROR_NOMATCH) ? LY_ENOT : LY_SUCCESS;
}